

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

int Curl_pgrsUpdate(connectdata *conn)

{
  Curl_easy *data;
  FILE *whereto;
  undefined1 auVar1 [12];
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  timediff_t tVar6;
  long seconds;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  curl_off_t cVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  curltime newer;
  curltime cVar18;
  curltime older;
  curltime older_00;
  long local_b0;
  long local_a8;
  char local_96 [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  data = conn->data;
  if (((data->progress).flags & 0x10) == 0) {
    if ((data->set).fxferinfo != (curl_xferinfo_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar4 = (*(data->set).fxferinfo)
                        ((data->set).progress_client,(data->progress).size_dl,
                         (data->progress).downloaded,(data->progress).size_ul,
                         (data->progress).uploaded);
LAB_001191d4:
      Curl_set_in_callback(data,false);
      if (iVar4 == 0) {
        return 0;
      }
      Curl_failf(data,"Callback aborted");
      return iVar4;
    }
    if ((data->set).fprogress != (curl_progress_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar4 = (*(data->set).fprogress)
                        ((data->set).progress_client,(double)(data->progress).size_dl,
                         (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                         (double)(data->progress).uploaded);
      goto LAB_001191d4;
    }
  }
  lVar13 = (data->progress).downloaded;
  lVar9 = (data->progress).uploaded;
  cVar18 = Curl_now();
  lVar5 = cVar18.tv_sec;
  uVar2 = (data->progress).start.tv_sec;
  uVar3 = (data->progress).start.tv_usec;
  older.tv_usec = uVar3;
  older.tv_sec = uVar2;
  auVar1 = cVar18._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar1._0_8_;
  newer.tv_usec = auVar1._8_4_;
  older._12_4_ = 0;
  tVar6 = Curl_timediff_us(newer,older);
  (data->progress).timespent = tVar6;
  seconds = tVar6 / 1000000;
  lVar12 = 999999;
  lVar16 = seconds;
  if (lVar13 < 0x20c49ba5e353f7) {
    lVar12 = 999;
    lVar16 = tVar6 / 1000;
  }
  lVar17 = 999999;
  lVar7 = lVar13 * 1000;
  if (0x20c49ba5e353f6 < lVar13) {
    lVar7 = lVar13;
  }
  if (tVar6 <= lVar12) {
    lVar16 = 1;
  }
  lVar13 = seconds;
  if (lVar9 < 0x20c49ba5e353f7) {
    lVar17 = 999;
    lVar9 = lVar9 * 1000;
    lVar13 = tVar6 / 1000;
  }
  (data->progress).dlspeed = lVar7 / lVar16;
  if (tVar6 <= lVar17) {
    lVar13 = 1;
  }
  (data->progress).ulspeed = lVar9 / lVar13;
  if ((data->progress).lastshow == lVar5) {
    return 0;
  }
  iVar4 = (data->progress).speeder_c;
  iVar14 = iVar4 % 6;
  uVar15 = (data->progress).flags;
  (data->progress).lastshow = lVar5;
  (data->progress).speeder[iVar14] = (data->progress).uploaded + (data->progress).downloaded;
  (data->progress).speeder_time[iVar14].tv_sec = lVar5;
  (data->progress).speeder_time[iVar14].tv_usec = cVar18.tv_usec;
  (data->progress).speeder_c = iVar4 + 1U;
  if (iVar4 == 0) {
    lVar13 = lVar9 / lVar13 + lVar7 / lVar16;
  }
  else {
    uVar10 = (ulong)(iVar4 + 1U) % 6;
    if (iVar4 < 5) {
      uVar10 = 0;
    }
    uVar8 = (ulong)(uint)((int)uVar10 << 4);
    cVar18._12_4_ = 0;
    cVar18.tv_sec = auVar1._0_8_;
    cVar18.tv_usec = auVar1._8_4_;
    older_00.tv_usec = *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + uVar8);
    older_00.tv_sec = *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + uVar8);
    older_00._12_4_ = 0;
    tVar6 = Curl_timediff(cVar18,older_00);
    lVar13 = tVar6 + (ulong)(tVar6 == 0);
    lVar9 = (data->progress).speeder[iVar14] - (data->progress).speeder[uVar10];
    if (lVar9 < 0x418938) {
      lVar13 = (lVar9 * 1000) / lVar13;
    }
    else {
      lVar13 = (long)((double)lVar9 / ((double)lVar13 / 1000.0));
    }
  }
  (data->progress).current_speed = lVar13;
  if ((uVar15 & 0x10) != 0) {
    return 0;
  }
  uVar15 = (data->progress).flags;
  if (-1 < (char)uVar15) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    uVar15 = (data->progress).flags | 0x80;
    (data->progress).flags = uVar15;
  }
  if (((uVar15 & 0x20) == 0) || (lVar13 = (data->progress).ulspeed, lVar13 < 1)) {
    local_b0 = 0;
    lVar13 = 0;
  }
  else {
    uVar10 = (data->progress).size_ul;
    lVar13 = (long)uVar10 / lVar13;
    if ((long)uVar10 < 0x2711) {
      if ((long)uVar10 < 1) {
        local_b0 = 0;
        goto LAB_001194ac;
      }
      cVar11 = (data->progress).uploaded * 100;
    }
    else {
      cVar11 = (data->progress).uploaded;
      uVar10 = uVar10 / 100;
    }
    local_b0 = cVar11 / (long)uVar10;
  }
LAB_001194ac:
  if (((uVar15 & 0x40) == 0) || (lVar9 = (data->progress).dlspeed, lVar9 < 1)) {
    local_a8 = 0;
    lVar9 = 0;
  }
  else {
    uVar10 = (data->progress).size_dl;
    lVar9 = (long)uVar10 / lVar9;
    if ((long)uVar10 < 0x2711) {
      if ((long)uVar10 < 1) {
        local_a8 = 0;
        goto LAB_00119519;
      }
      cVar11 = (data->progress).downloaded * 100;
    }
    else {
      cVar11 = (data->progress).downloaded;
      uVar10 = uVar10 / 100;
    }
    local_a8 = cVar11 / (long)uVar10;
  }
LAB_00119519:
  if (lVar9 < lVar13) {
    lVar9 = lVar13;
  }
  cVar11 = 0;
  if (0 < lVar9) {
    cVar11 = lVar9 - seconds;
  }
  time2str(time_left,cVar11);
  time2str(time_total,lVar9);
  time2str(local_96,seconds);
  uVar15 = (data->progress).flags;
  uVar10 = (&(data->progress).size_dl)[(ulong)((uVar15 & 0x40) == 0) * 2] +
           (&(data->progress).size_ul)[(ulong)((uVar15 & 0x20) == 0) * 2];
  lVar13 = (data->progress).uploaded + (data->progress).downloaded;
  if ((long)uVar10 < 0x2711) {
    if ((long)uVar10 < 1) {
      lVar13 = 0;
    }
    else {
      lVar13 = (lVar13 * 100) / (long)uVar10;
    }
  }
  else {
    lVar13 = lVar13 / (long)(uVar10 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar10,max5[2]);
  max5data((data->progress).downloaded,max5[0]);
  max5data((data->progress).uploaded,max5[1]);
  max5data((data->progress).dlspeed,max5[3]);
  max5data((data->progress).ulspeed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",lVar13,max5 + 2,local_a8,
                max5,local_b0,max5 + 1,max5 + 3,max5 + 4,time_total,local_96,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  if(!(data->progress.flags & PGRS_HIDE)) {
    if(data->set.fxferinfo) {
      int result;
      /* There's a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.size_dl,
                                   data->progress.downloaded,
                                   data->progress.size_ul,
                                   data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
    if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.size_dl,
                                   (double)data->progress.downloaded,
                                   (double)data->progress.size_ul,
                                   (double)data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
  }
  progress_meter(conn);

  return 0;
}